

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O1

TSpirvRequirement * __thiscall
glslang::TParseContext::mergeSpirvRequirements
          (TParseContext *this,TSourceLoc *loc,TSpirvRequirement *spirvReq1,
          TSpirvRequirement *spirvReq2)

{
  if ((spirvReq2->extensions).
      super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    if ((spirvReq1->extensions).
        super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
      ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                   *)spirvReq1,
                  (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                   *)spirvReq2);
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"too many SPIR-V requirements","extensions","");
    }
  }
  if ((spirvReq2->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t.
      _M_impl.super__Rb_tree_header._M_node_count != 0) {
    if ((spirvReq1->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t
        ._M_impl.super__Rb_tree_header._M_node_count == 0) {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_glslang::pool_allocator<int>_>::
      operator=((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_glslang::pool_allocator<int>_>
                 *)&spirvReq1->capabilities,
                (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_glslang::pool_allocator<int>_>
                 *)&spirvReq2->capabilities);
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"too many SPIR-V requirements","capabilities","");
    }
  }
  return spirvReq1;
}

Assistant:

TSpirvRequirement* TParseContext::mergeSpirvRequirements(const TSourceLoc& loc, TSpirvRequirement* spirvReq1,
                                                         TSpirvRequirement* spirvReq2)
{
    // Merge the second SPIR-V requirement to the first one
    if (!spirvReq2->extensions.empty()) {
        if (spirvReq1->extensions.empty())
            spirvReq1->extensions = spirvReq2->extensions;
        else
            error(loc, "too many SPIR-V requirements", "extensions", "");
    }

    if (!spirvReq2->capabilities.empty()) {
        if (spirvReq1->capabilities.empty())
            spirvReq1->capabilities = spirvReq2->capabilities;
        else
            error(loc, "too many SPIR-V requirements", "capabilities", "");
    }

    return spirvReq1;
}